

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O3

void ncnn::convdw3x3s2_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  ulong uVar16;
  pointer pfVar17;
  void *pvVar18;
  size_t sVar19;
  size_t sVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  uint uVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  char *pcVar30;
  long lVar31;
  void *pvVar32;
  char *pcVar33;
  char *pcVar34;
  float *pfVar35;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int size;
  
  auVar25 = _DAT_00516ce0;
  auVar24 = _DAT_00516cc0;
  iVar11 = top_blob->c;
  if (0 < (long)iVar11) {
    iVar12 = top_blob->w;
    iVar13 = top_blob->h;
    iVar14 = bottom_blob->w;
    iVar23 = (iVar14 - iVar12) * 2;
    pvVar15 = top_blob->data;
    uVar16 = top_blob->elemsize;
    lVar27 = top_blob->cstep * uVar16;
    lVar31 = 0;
    pfVar17 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar28 = (int)((uVar16 * (long)iVar13 * (long)iVar12 + 0xf & 0xfffffffffffffff0) / uVar16);
    if (top_blob->dims == 4) {
      iVar28 = (int)((long)iVar13 * (long)iVar12);
    }
    uVar26 = iVar28 * top_blob->d;
    pvVar18 = bottom_blob->data;
    sVar19 = bottom_blob->cstep;
    sVar20 = bottom_blob->elemsize;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (ulong)uVar26 - 1;
    auVar37 = vpshufd_avx(auVar37,0x44);
    uVar16 = auVar37._0_8_;
    auVar38._0_8_ = uVar16 ^ 0x8000000000000000;
    auVar38._8_4_ = auVar37._8_4_;
    uVar21 = auVar37._12_4_;
    auVar38._12_4_ = uVar21 ^ 0x80000000;
    auVar37 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
    pvVar32 = pvVar15;
    do {
      if (_bias == (Mat *)0x0) {
        auVar39 = ZEXT816(0) << 0x40;
      }
      else {
        auVar39 = ZEXT416(*(uint *)((long)&_bias->data + lVar31 * 4));
      }
      fVar7 = pfVar17[lVar31];
      if (0 < (int)uVar26) {
        auVar39 = vshufps_avx(auVar39,auVar39,0);
        auVar40._16_16_ = auVar39;
        auVar40._0_16_ = auVar39;
        uVar29 = 0;
        do {
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar29;
          auVar39 = vpshufd_avx(auVar39,0x44);
          auVar42._16_16_ = auVar39;
          auVar42._0_16_ = auVar39;
          auVar43 = vorps_avx(auVar42,auVar24);
          auVar42 = vorps_avx(auVar42,auVar25);
          auVar45._0_8_ = auVar42._16_8_ ^ 0x8000000000000000;
          auVar45._8_4_ = auVar42._24_4_;
          auVar45._12_4_ = auVar42._28_4_ ^ 0x80000000;
          auVar39 = vpcmpgtq_avx(auVar45,auVar38);
          auVar47._0_8_ = uVar16 ^ 0x8000000000000000;
          auVar47._8_4_ = auVar38._8_4_;
          auVar47._12_4_ = uVar21 ^ 0x80000000;
          auVar41._0_8_ = auVar42._0_8_ ^ 0x8000000000000000;
          auVar41._8_4_ = auVar42._8_4_;
          auVar41._12_4_ = auVar42._12_4_ ^ 0x80000000;
          auVar41 = vpcmpgtq_avx(auVar41,auVar47);
          auVar39 = vpackssdw_avx(auVar41,auVar39);
          auVar46._0_8_ = auVar43._16_8_ ^ 0x8000000000000000;
          auVar46._8_4_ = auVar43._24_4_;
          auVar46._12_4_ = auVar43._28_4_ ^ 0x80000000;
          auVar41 = vpcmpgtq_avx(auVar46,auVar38);
          auVar48._0_8_ = uVar16 ^ 0x8000000000000000;
          auVar48._8_4_ = auVar38._8_4_;
          auVar48._12_4_ = uVar21 ^ 0x80000000;
          auVar44._0_8_ = auVar43._0_8_ ^ 0x8000000000000000;
          auVar44._8_4_ = auVar43._8_4_;
          auVar44._12_4_ = auVar43._12_4_ ^ 0x80000000;
          auVar44 = vpcmpgtq_avx(auVar44,auVar48);
          auVar41 = vpackssdw_avx(auVar44,auVar41);
          auVar39 = vpackssdw_avx(auVar41 ^ auVar37,auVar39 ^ auVar37);
          auVar41 = vpmovsxwd_avx(auVar39);
          auVar39 = vpunpckhwd_avx(auVar39,auVar39);
          auVar43._16_16_ = auVar39;
          auVar43._0_16_ = auVar41;
          auVar43 = vmaskmovps_avx(auVar43,auVar40);
          *(undefined1 (*) [32])((long)pvVar32 + uVar29 * 4) = auVar43;
          uVar29 = uVar29 + 8;
        } while ((uVar26 + 7 & 0xfffffff8) != uVar29);
      }
      if (0 < iVar13) {
        pfVar35 = (float *)(lVar27 * lVar31 + (long)pvVar15);
        lVar22 = lVar31 * 9;
        pcVar33 = (char *)(sVar19 * sVar20 * lVar31 + (long)pvVar18);
        pcVar30 = pcVar33 + (long)iVar14 * 2;
        pcVar34 = pcVar33 + iVar14;
        iVar28 = 0;
        do {
          uVar36 = iVar12 + 1;
          if (0 < iVar12) {
            do {
              cVar8 = *pcVar33;
              pcVar1 = pcVar33 + 1;
              pcVar2 = pcVar33 + 2;
              pcVar33 = pcVar33 + 2;
              cVar9 = *pcVar34;
              pcVar3 = pcVar34 + 1;
              pcVar4 = pcVar34 + 2;
              pcVar34 = pcVar34 + 2;
              cVar10 = *pcVar30;
              pcVar5 = pcVar30 + 1;
              pcVar6 = pcVar30 + 2;
              pcVar30 = pcVar30 + 2;
              *pfVar35 = fVar7 * (float)((int)*(char *)((long)&_kernel->refcount + lVar22) *
                                         (int)*pcVar6 +
                                         (int)*(char *)((long)&_kernel->data + lVar22 + 7) *
                                         (int)*pcVar5 +
                                        (int)*(char *)((long)&_kernel->data + lVar22 + 6) *
                                        (int)cVar10 +
                                        (int)*(char *)((long)&_kernel->data + lVar22 + 5) *
                                        (int)*pcVar4 +
                                        (int)*(char *)((long)&_kernel->data + lVar22 + 4) *
                                        (int)*pcVar3 +
                                        (int)*(char *)((long)&_kernel->data + lVar22 + 3) *
                                        (int)cVar9 +
                                        (int)*(char *)((long)&_kernel->data + lVar22 + 2) *
                                        (int)*pcVar2 +
                                        (int)*(char *)((long)&_kernel->data + lVar22 + 1) *
                                        (int)*pcVar1 +
                                        (int)*(char *)((long)&_kernel->data + lVar22) * (int)cVar8)
                         + *pfVar35;
              pfVar35 = pfVar35 + 1;
              uVar36 = uVar36 - 1;
            } while (1 < uVar36);
          }
          pcVar33 = pcVar33 + iVar23;
          pcVar34 = pcVar34 + iVar23;
          pcVar30 = pcVar30 + iVar23;
          iVar28 = iVar28 + 1;
        } while (iVar28 != iVar13);
      }
      lVar31 = lVar31 + 1;
      pvVar32 = (void *)((long)pvVar32 + lVar27);
    } while (lVar31 != iVar11);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}